

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O0

bool __thiscall
GlobOpt::IsPrepassSrcValueInfoPrecise
          (GlobOpt *this,Opnd *src,Value *srcValue,bool *isSafeToTransferInPrepass)

{
  code *pcVar1;
  bool bVar2;
  bool bVar3;
  undefined4 *puVar4;
  Sym *pSVar5;
  StackSym *this_00;
  ValueInfo *pVVar6;
  RegOpnd *pRVar7;
  bool local_59;
  bool isSafeToTransfer;
  StackSym *srcSym;
  bool isValueInfoDefinite;
  ValueInfo *srcValueInfo;
  bool *isSafeToTransferInPrepass_local;
  Value *srcValue_local;
  Opnd *src_local;
  GlobOpt *this_local;
  
  bVar2 = IsLoopPrePass(this);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x1634,"(IsLoopPrePass())","IsLoopPrePass()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  if (src == (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x1635,"(src)","src");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  if (isSafeToTransferInPrepass != (bool *)0x0) {
    *isSafeToTransferInPrepass = false;
  }
  bVar2 = IR::Opnd::IsAddrOpnd(src);
  if (bVar2) {
    pVVar6 = ::Value::GetValueInfo(srcValue);
    pSVar5 = ValueInfo::GetSymStore(pVVar6);
    if (pSVar5 != (Sym *)0x0) {
      pVVar6 = ::Value::GetValueInfo(srcValue);
      pSVar5 = ValueInfo::GetSymStore(pVVar6);
      bVar2 = Sym::IsStackSym(pSVar5);
      if (bVar2) {
        pVVar6 = ::Value::GetValueInfo(srcValue);
        pSVar5 = ValueInfo::GetSymStore(pVVar6);
        this_00 = Sym::AsStackSym(pSVar5);
        bVar2 = StackSym::IsFromByteCodeConstantTable(this_00);
        if (bVar2) {
          if (isSafeToTransferInPrepass != (bool *)0x0) {
            *isSafeToTransferInPrepass = false;
          }
          return true;
        }
      }
    }
  }
  bVar2 = IR::Opnd::IsRegOpnd(src);
  if ((bVar2) && (srcValue != (Value *)0x0)) {
    pVVar6 = ::Value::GetValueInfo(srcValue);
    bVar2 = ValueType::IsDefinite(&pVVar6->super_ValueType);
    pRVar7 = IR::Opnd::AsRegOpnd(src);
    bVar3 = IsSafeToTransferInPrepass(this,pRVar7->m_sym,pVVar6);
    if (isSafeToTransferInPrepass != (bool *)0x0) {
      *isSafeToTransferInPrepass = bVar3;
    }
    local_59 = false;
    if (bVar2) {
      local_59 = bVar3;
    }
    this_local._7_1_ = local_59;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool
GlobOpt::IsPrepassSrcValueInfoPrecise(IR::Opnd *const src, Value *const srcValue, bool * isSafeToTransferInPrepass) const
{
    Assert(IsLoopPrePass());
    Assert(src);

    if (isSafeToTransferInPrepass)
    {
        *isSafeToTransferInPrepass = false;
    }

    if (src->IsAddrOpnd() &&
        srcValue->GetValueInfo()->GetSymStore() &&
        srcValue->GetValueInfo()->GetSymStore()->IsStackSym() &&
        srcValue->GetValueInfo()->GetSymStore()->AsStackSym()->IsFromByteCodeConstantTable())
    {
        if (isSafeToTransferInPrepass)
        {
            *isSafeToTransferInPrepass = false;
        }
        return true;
    }

    if (!src->IsRegOpnd() || !srcValue)
    {
        return false;
    }

    ValueInfo *const srcValueInfo = srcValue->GetValueInfo();
    bool isValueInfoDefinite = srcValueInfo->IsDefinite();

    StackSym * srcSym = src->AsRegOpnd()->m_sym;

    bool isSafeToTransfer = IsSafeToTransferInPrepass(srcSym, srcValueInfo);
    if (isSafeToTransferInPrepass)
    {
        *isSafeToTransferInPrepass = isSafeToTransfer;
    }

    return isValueInfoDefinite && isSafeToTransfer;
}